

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

char * indexInAffinityOk(Parse *pParse,WhereTerm *pTerm,u8 idxaff)

{
  Expr *pExpr;
  ulong uVar1;
  int iVar2;
  long lVar3;
  CollSeq *pCVar4;
  char *pcVar5;
  Expr *pExpr_00;
  long in_FS_OFFSET;
  Expr inexpr;
  undefined1 *local_78;
  anon_union_8_2_443a03b8_for_u aStack_70;
  Expr *local_68;
  Expr *pEStack_60;
  anon_union_8_2_a01b6dbf_for_x local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  AggInfo *pAStack_40;
  anon_union_8_3_c79b3df9_for_y local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pExpr_00 = pTerm->pExpr;
  local_38.pTab = (Table *)&DAT_aaaaaaaaaaaaaaaa;
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  pAStack_40 = (AggInfo *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.pList = (ExprList *)&DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  local_68 = (Expr *)&DAT_aaaaaaaaaaaaaaaa;
  pEStack_60 = (Expr *)&DAT_aaaaaaaaaaaaaaaa;
  local_78 = &DAT_aaaaaaaaaaaaaaaa;
  aStack_70.zToken = &DAT_aaaaaaaaaaaaaaaa;
  pExpr = pExpr_00->pLeft;
  iVar2 = sqlite3ExprIsVector(pExpr);
  if (iVar2 != 0) {
    lVar3 = (long)(pTerm->u).x.iField;
    uVar1 = (ulong)local_78 >> 8;
    local_78 = (undefined1 *)CONCAT71((uint7)uVar1 & 0xffffff,0x36);
    local_68 = ((pExpr->x).pList)->a[lVar3 + -1].pExpr;
    pEStack_60 = ((pExpr_00->x).pSelect)->pEList->a[lVar3 + -1].pExpr;
    pExpr_00 = (Expr *)&local_78;
  }
  iVar2 = sqlite3IndexAffinityOk(pExpr_00,idxaff);
  if (iVar2 == 0) {
    pcVar5 = (char *)0x0;
  }
  else {
    pCVar4 = sqlite3ExprCompareCollSeq(pParse,pExpr_00);
    if (pCVar4 == (CollSeq *)0x0) {
      pcVar5 = "BINARY";
    }
    else {
      pcVar5 = pCVar4->zName;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return pcVar5;
  }
  __stack_chk_fail();
}

Assistant:

static SQLITE_NOINLINE const char *indexInAffinityOk(
  Parse *pParse,
  WhereTerm *pTerm,
  u8 idxaff
){
  Expr *pX = pTerm->pExpr;
  Expr inexpr;

  assert( pTerm->eOperator & WO_IN );

  if( sqlite3ExprIsVector(pX->pLeft) ){
    int iField = pTerm->u.x.iField - 1;
    inexpr.flags = 0;
    inexpr.op = TK_EQ;
    inexpr.pLeft = pX->pLeft->x.pList->a[iField].pExpr;
    assert( ExprUseXSelect(pX) );
    inexpr.pRight = pX->x.pSelect->pEList->a[iField].pExpr;
    pX = &inexpr;
  }

  if( sqlite3IndexAffinityOk(pX, idxaff) ){
    CollSeq *pRet = sqlite3ExprCompareCollSeq(pParse, pX);
    return pRet ? pRet->zName : sqlite3StrBINARY;
  }
  return 0;
}